

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptFunction.cpp
# Opt level: O0

void __thiscall
Js::ScriptFunctionWithInlineCache::FreeOwnInlineCaches<false>(ScriptFunctionWithInlineCache *this)

{
  Type TVar1;
  InlineCache *this_00;
  code *pcVar2;
  uint uVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  void ***pppvVar8;
  ParseableFunctionInfo *this_01;
  ScriptContext *this_02;
  InlineCacheAllocator *allocator;
  CacheAllocator *allocator_00;
  undefined4 *puVar9;
  ThreadContext *this_03;
  InlineCache *inlineCache;
  uint local_28;
  uint plainInlineCacheEnd;
  uint unregisteredInlineCacheCount;
  uint i;
  ScriptContext *scriptContext;
  uint totalCacheCount;
  uint isInstInlineCacheStart;
  ScriptFunctionWithInlineCache *this_local;
  
  uVar5 = GetInlineCacheCount(this);
  TVar1 = this->isInstInlineCacheCount;
  bVar4 = ScriptFunction::GetHasInlineCaches(&this->super_ScriptFunction);
  if ((bVar4) &&
     (pppvVar8 = Memory::WriteBarrierPtr::operator_cast_to_void___
                           ((WriteBarrierPtr *)&this->m_inlineCaches), *pppvVar8 != (void **)0x0)) {
    this_01 = JavascriptFunction::GetParseableFunctionInfo((JavascriptFunction *)this);
    this_02 = FunctionProxy::GetScriptContext(&this_01->super_FunctionProxy);
    plainInlineCacheEnd = 0;
    local_28 = 0;
    uVar7 = this->rootObjectLoadInlineCacheStart;
    for (; uVar3 = uVar5, plainInlineCacheEnd < uVar7; plainInlineCacheEnd = plainInlineCacheEnd + 1
        ) {
      pppvVar8 = Memory::WriteBarrierPtr::operator_cast_to_void___
                           ((WriteBarrierPtr *)&this->m_inlineCaches);
      if ((*pppvVar8)[plainInlineCacheEnd] != (void *)0x0) {
        pppvVar8 = Memory::WriteBarrierPtr::operator_cast_to_void___
                             ((WriteBarrierPtr *)&this->m_inlineCaches);
        this_00 = (InlineCache *)(*pppvVar8)[plainInlineCacheEnd];
        uVar6 = (*(this_02->super_ScriptContextInfo)._vptr_ScriptContextInfo[0x24])();
        if ((uVar6 & 1) == 0) {
          bVar4 = InlineCache::RemoveFromInvalidationList(this_00);
          if (bVar4) {
            local_28 = local_28 + 1;
          }
          allocator = ScriptContext::GetInlineCacheAllocator(this_02);
          Memory::
          DeleteObject<Memory::InlineCacheAllocator,(Memory::AllocatorDeleteFlags)0,Js::InlineCache>
                    (allocator,this_00);
        }
        pppvVar8 = Memory::WriteBarrierPtr::operator_cast_to_void___
                             ((WriteBarrierPtr *)&this->m_inlineCaches);
        (*pppvVar8)[plainInlineCacheEnd] = (void *)0x0;
      }
    }
    while (plainInlineCacheEnd = uVar3, plainInlineCacheEnd < uVar5 + TVar1) {
      pppvVar8 = Memory::WriteBarrierPtr::operator_cast_to_void___
                           ((WriteBarrierPtr *)&this->m_inlineCaches);
      if ((*pppvVar8)[plainInlineCacheEnd] != (void *)0x0) {
        uVar7 = (*(this_02->super_ScriptContextInfo)._vptr_ScriptContextInfo[0x24])();
        if ((uVar7 & 1) == 0) {
          allocator_00 = ScriptContext::GetIsInstInlineCacheAllocator(this_02);
          pppvVar8 = Memory::WriteBarrierPtr::operator_cast_to_void___
                               ((WriteBarrierPtr *)&this->m_inlineCaches);
          Memory::
          DeleteObject<Memory::CacheAllocator,(Memory::AllocatorDeleteFlags)0,Js::IsInstInlineCache>
                    (allocator_00,(IsInstInlineCache *)(*pppvVar8)[plainInlineCacheEnd]);
        }
        pppvVar8 = Memory::WriteBarrierPtr::operator_cast_to_void___
                             ((WriteBarrierPtr *)&this->m_inlineCaches);
        (*pppvVar8)[plainInlineCacheEnd] = (void *)0x0;
      }
      uVar3 = plainInlineCacheEnd + 1;
    }
    if (local_28 != 0) {
      uVar7 = (*(this_02->super_ScriptContextInfo)._vptr_ScriptContextInfo[0x24])();
      if ((uVar7 & 1) != 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar9 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ScriptFunction.cpp"
                                    ,0x2d0,"(!isShutdown && !scriptContext->IsClosed())",
                                    "Unregistration of inlineCache should only be done if this is not shutdown or scriptContext closing."
                                   );
        if (!bVar4) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar9 = 0;
      }
      this_03 = ScriptContext::GetThreadContext(this_02);
      ThreadContext::NotifyInlineCacheBatchUnregistered(this_03,local_28);
    }
  }
  return;
}

Assistant:

void ScriptFunctionWithInlineCache::FreeOwnInlineCaches()
    {
        uint isInstInlineCacheStart = this->GetInlineCacheCount();
        uint totalCacheCount = isInstInlineCacheStart + isInstInlineCacheCount;
        if (this->GetHasInlineCaches() && this->m_inlineCaches)
        {
            Js::ScriptContext* scriptContext = this->GetParseableFunctionInfo()->GetScriptContext();
            uint i = 0;
            uint unregisteredInlineCacheCount = 0;
            uint plainInlineCacheEnd = rootObjectLoadInlineCacheStart;
            __analysis_assume(plainInlineCacheEnd < totalCacheCount);
            for (; i < plainInlineCacheEnd; i++)
            {
                if (this->m_inlineCaches[i])
                {
                    InlineCache* inlineCache = (InlineCache*)(void*)this->m_inlineCaches[i];
                    if (isShutdown)
                    {
                        inlineCache->Clear();
                    }
                    else if(!scriptContext->IsClosed())
                    {
                        if (inlineCache->RemoveFromInvalidationList())
                        {
                            unregisteredInlineCacheCount++;
                        }
                        AllocatorDelete(InlineCacheAllocator, scriptContext->GetInlineCacheAllocator(), inlineCache);
                    }
                    this->m_inlineCaches[i] = nullptr;
                }
            }

            i = isInstInlineCacheStart;
            for (; i < totalCacheCount; i++)
            {
                if (this->m_inlineCaches[i])
                {
                    if (isShutdown)
                    {
                        ((IsInstInlineCache*)this->m_inlineCaches[i])->Clear();
                    }
                    else if (!scriptContext->IsClosed())
                    {
                        AllocatorDelete(CacheAllocator, scriptContext->GetIsInstInlineCacheAllocator(), (IsInstInlineCache*)(void*)this->m_inlineCaches[i]);
                    }
                    this->m_inlineCaches[i] = nullptr;
                }
            }

            if (unregisteredInlineCacheCount > 0)
            {
                AssertMsg(!isShutdown && !scriptContext->IsClosed(), "Unregistration of inlineCache should only be done if this is not shutdown or scriptContext closing.");
                scriptContext->GetThreadContext()->NotifyInlineCacheBatchUnregistered(unregisteredInlineCacheCount);
            }
        }
    }